

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O2

void __thiscall diy::Collection::destroy(Collection *this,int i)

{
  void *__args;
  
  __args = (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start[i];
  if (__args == (void *)0x0) {
    if ((this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[i] != -1) {
      (**(code **)(*(long *)this->storage_ + 0x20))();
      return;
    }
  }
  else {
    std::function<void_(void_*)>::operator()(&this->destroy_,__args);
    (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start[i] = (void *)0x0;
  }
  return;
}

Assistant:

void          destroy(int i)                  { if (find(i)) { destroy_(find(i)); elements_[static_cast<size_t>(i)] = 0; } else if (external_[static_cast<size_t>(i)] != -1) storage_->destroy(external_[static_cast<size_t>(i)]); }